

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.hpp
# Opt level: O2

void __thiscall TasOptimization::ParticleSwarmState::~ParticleSwarmState(ParticleSwarmState *this)

{
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->cache_best_particle_inside).super__Bvector_base<std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->cache_particle_inside).super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->cache_best_particle_fvals).super__Vector_base<double,_std::allocator<double>_>)
  ;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->cache_particle_fvals).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->best_particle_positions).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->particle_velocities).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->particle_positions).super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

ParticleSwarmState() = delete;